

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O1

PList * p_hash_table_keys(PHashTable *table)

{
  PList *list;
  ulong uVar1;
  PHashTableNode *pPVar2;
  
  if (table == (PHashTable *)0x0) {
    return (PList *)0x0;
  }
  uVar1 = 0;
  if (table->size == 0) {
    list = (PList *)0x0;
  }
  else {
    list = (PList *)0x0;
    do {
      for (pPVar2 = table->table[uVar1]; pPVar2 != (PHashTableNode *)0x0; pPVar2 = pPVar2->next) {
        list = p_list_append(list,pPVar2->key);
      }
      uVar1 = (ulong)((int)uVar1 + 1);
    } while (uVar1 < table->size);
  }
  return list;
}

Assistant:

P_LIB_API PList *
p_hash_table_keys (const PHashTable *table)
{
	PList		*ret = NULL;
	PHashTableNode	*node;
	puint		i;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; node = node->next)
			ret = p_list_append (ret, node->key);

	return ret;
}